

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRUP.cpp
# Opt level: O2

bool __thiscall SRUP_MSG::sequenceID(SRUP_MSG *this,uint64_t *sid)

{
  uint64_t *puVar1;
  
  if (this->m_sequence_ID != (uint64_t *)0x0) {
    operator_delete(this->m_sequence_ID);
  }
  puVar1 = (uint64_t *)operator_new(8);
  this->m_sequence_ID = puVar1;
  *puVar1 = *sid;
  return true;
}

Assistant:

bool SRUP_MSG::sequenceID(const uint64_t *sid)
{
    try
    {
        if (m_sequence_ID != nullptr)
            delete(m_sequence_ID);

        m_sequence_ID = new uint64_t;
        std::memcpy(m_sequence_ID, sid, sizeof(uint64_t));
    }
    catch (...)
    {
        m_sequence_ID = nullptr;
        return false;
    }
    return true;
}